

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O1

longlong __thiscall
cmsys::SystemInformationImplementation::GetHostMemoryUsed(SystemInformationImplementation *this)

{
  int iVar1;
  longlong values2 [2];
  longlong values4 [4];
  longlong local_38;
  long lStack_30;
  longlong local_28;
  long lStack_20;
  long local_18;
  long lStack_10;
  
  local_38 = 0;
  lStack_30 = 0;
  iVar1 = anon_unknown_3::GetFieldsFromFile<long_long>
                    ("/proc/meminfo",&PTR_anon_var_dwarf_2276f61_008d47c0,&local_38);
  if (iVar1 == 0) {
    local_28 = local_38 - lStack_30;
  }
  else {
    local_18 = 0;
    lStack_10 = 0;
    local_28 = 0;
    lStack_20 = 0;
    iVar1 = anon_unknown_3::GetFieldsFromFile<long_long>
                      ("/proc/meminfo",&PTR_anon_var_dwarf_2276f61_008d47e0,&local_28);
    if (iVar1 == 0) {
      local_28 = local_28 - (lStack_20 + local_18 + lStack_10);
    }
    else {
      local_28 = (longlong)iVar1;
    }
  }
  return local_28;
}

Assistant:

long long SystemInformationImplementation::GetHostMemoryUsed()
{
#if defined(_WIN32)
#  if defined(_MSC_VER) && _MSC_VER < 1300
  MEMORYSTATUS stat;
  stat.dwLength = sizeof(stat);
  GlobalMemoryStatus(&stat);
  return (stat.dwTotalPhys - stat.dwAvailPhys) / 1024;
#  else
  MEMORYSTATUSEX statex;
  statex.dwLength = sizeof(statex);
  GlobalMemoryStatusEx(&statex);
  return (statex.ullTotalPhys - statex.ullAvailPhys) / 1024;
#  endif
#elif defined(__CYGWIN__)
  const char* names[3] = { "MemTotal:", "MemFree:", nullptr };
  long long values[2] = { 0 };
  int ierr = GetFieldsFromFile("/proc/meminfo", names, values);
  if (ierr) {
    return ierr;
  }
  long long& memTotal = values[0];
  long long& memFree = values[1];
  return memTotal - memFree;
#elif defined(__linux)
  // First try to use MemAvailable, but it only works on newer kernels
  const char* names2[3] = { "MemTotal:", "MemAvailable:", nullptr };
  long long values2[2] = { 0 };
  int ierr = GetFieldsFromFile("/proc/meminfo", names2, values2);
  if (ierr) {
    const char* names4[5] = { "MemTotal:", "MemFree:", "Buffers:", "Cached:",
                              nullptr };
    long long values4[4] = { 0 };
    ierr = GetFieldsFromFile("/proc/meminfo", names4, values4);
    if (ierr) {
      return ierr;
    }
    long long& memTotal = values4[0];
    long long& memFree = values4[1];
    long long& memBuffers = values4[2];
    long long& memCached = values4[3];
    return memTotal - memFree - memBuffers - memCached;
  }
  long long& memTotal = values2[0];
  long long& memAvail = values2[1];
  return memTotal - memAvail;
#elif defined(__APPLE__)
  long long psz = getpagesize();
  if (psz < 1) {
    return -1;
  }
  const char* names[3] = { "Pages wired down:", "Pages active:", nullptr };
  long long values[2] = { 0 };
  int ierr = GetFieldsFromCommand("vm_stat", names, values);
  if (ierr) {
    return -1;
  }
  long long& vmWired = values[0];
  long long& vmActive = values[1];
  return ((vmActive + vmWired) * psz) / 1024;
#else
  return 0;
#endif
}